

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O2

void __thiscall tst_qpromise_reduce::delayedRejected(tst_qpromise_reduce *this)

{
  QSharedData *pQVar1;
  char16_t *pcVar2;
  bool bVar3;
  PromiseData<int> *pPVar4;
  QPromiseReject<int> *in_R8;
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_190;
  QArrayDataPointer<char16_t> local_188;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QStack_160;
  Type p1;
  PromiseResolver<int> resolver_1;
  _Any_data local_128;
  QVector<int> *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Type p0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f0;
  function<void_(const_QList<int>_&)> local_e8;
  QVector<int> v1;
  QVector<int> v0;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QVector<int> inputs;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_48;
  
  local_128._M_unused._M_object = (void *)0x600000004;
  local_128._8_4_ = 8;
  args._M_len = 3;
  args._M_array = (iterator)&local_128;
  QList<int>::QList(&inputs,args);
  v0.d.d = (Data *)0x0;
  v0.d.ptr = (int *)0x0;
  v0.d.size = 0;
  v1.d.d = (Data *)0x0;
  v1.d.ptr = (int *)0x0;
  v1.d.size = 0;
  QtPromise::resolve<QList<int>&>((QtPromise *)&local_188,&inputs);
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d380;
  pPVar4 = (PromiseData<int> *)operator_new(0x68);
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar4);
  LOCK();
  pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar4 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014d570;
  p0.super_QPromiseBase<int>.m_d.d = pPVar4;
  local_e8.super__Function_base._M_functor._8_8_ = pPVar4;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_e8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e8);
  pcVar2 = local_188.ptr;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    resolver_1 = resolver;
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_190.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_190 = resolver_1.m_d.d;
  }
  local_170.d = (Data *)0x0;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_190.d != (Data *)0x0) {
    LOCK();
    ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = &v0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_128._M_unused._0_8_ = resolver_1.m_d.d;
  local_128._8_8_ = local_190.d;
  local_88._M_unused._M_object = operator_new(0x18);
  *(void **)local_88._M_unused._0_8_ = local_128._M_unused._M_object;
  if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_128._M_unused._0_8_ = *local_128._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_128._8_8_;
  if ((Data *)local_128._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_128._8_8_ = *(int *)local_128._8_8_ + 1;
    UNLOCK();
  }
  *(QVector<int> **)((long)local_88._M_unused._0_8_ + 0x10) = local_118;
  pcStack_70 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::$_0,QList<int>>(tst_qpromise_reduce::delayedRejected()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::$_0,QList<int>>(tst_qpromise_reduce::delayedRejected()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_128._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pcVar2,
             (function<void_(const_QList<int>_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  pcVar2 = local_188.ptr;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_48,(PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&resolver_1,
             (QPromiseResolve<int> *)&local_190,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pcVar2,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d570;
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_188.ptr);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_188.ptr);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&local_188);
  QtPromise::resolve<QList<int>&>((QtPromise *)&resolver,&inputs);
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d380;
  pPVar4 = (PromiseData<int> *)operator_new(0x68);
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar4);
  LOCK();
  pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar4 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_188.d = (Data *)&PTR__QPromiseBase_0014d570;
  local_188.ptr = (char16_t *)pPVar4;
  p1.super_QPromiseBase<int>.m_d.d = pPVar4;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_188);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_188);
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_190.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_190 = resolver_1.m_d.d;
  }
  local_170.d = (Data *)0x0;
  if (local_190.d == (Data *)0x0) {
    local_128._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_128._8_8_ = local_190.d;
  }
  local_f8.d = (Data *)0x0;
  if (local_190.d != (Data *)0x0) {
    LOCK();
    ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_190.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_128._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_128._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_128._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = &v1;
  uStack_110 = 2;
  local_e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8._M_invoker = (_Invoker_type)0x0;
  local_128._M_unused._0_8_ = (undefined8)local_190.d;
  local_f0.d = (Data *)local_128._8_8_;
  local_e8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_e8.super__Function_base._M_functor._M_unused._0_8_ = local_128._M_unused._M_object
  ;
  if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_128._M_unused._0_8_ = *local_128._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_128._8_8_;
  if ((Data *)local_128._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_128._8_8_ = *(int *)local_128._8_8_ + 1;
    UNLOCK();
  }
  *(QVector<int> **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       local_118;
  *(ulong *)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       CONCAT44(uStack_10c,uStack_110);
  local_e8._M_invoker =
       std::
       _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::$_1,int>(tst_qpromise_reduce::delayedRejected()::$_1,int)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::$_1,int>(tst_qpromise_reduce::delayedRejected()::$_1,int)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_128._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(QStack_160.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,&local_e8
            );
  std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_190,
             (QPromiseResolve<int> *)&local_f0,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(QStack_160.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d570;
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(QStack_160.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(QStack_160.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&resolver);
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  resolver.m_d.d._0_1_ = 1;
  local_188.d._0_1_ = bVar3;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_188,(bool *)&resolver,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                     ,0xf0);
  if (bVar3) {
    local_188.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                   (&(p1.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    resolver.m_d.d._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_188,(bool *)&resolver,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                       ,0xf1);
    if (bVar3) {
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
      waitForError<int,QString>((QString *)&local_188,&p0,(QString *)&resolver);
      QString::QString((QString *)&resolver_1,"foo");
      bVar3 = QTest::qCompare((QString *)&local_188,(QString *)&resolver_1,
                              "waitForError(p0, QString{})","QString{\"foo\"}",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                              ,0xf2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver_1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
      if (bVar3) {
        resolver.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0
        ;
        waitForError<int,QString>((QString *)&local_188,&p1,(QString *)&resolver);
        QString::QString((QString *)&resolver_1,"bar");
        bVar3 = QTest::qCompare((QString *)&local_188,(QString *)&resolver_1,
                                "waitForError(p1, QString{})","QString{\"bar\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                                ,0xf3);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
        if (bVar3) {
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               (Data *)0x600000004;
          args_00._M_len = 3;
          args_00._M_array = (iterator)&resolver;
          QList<int>::QList((QList<int> *)&local_188,args_00);
          bVar3 = QTest::qCompare<int>
                            (&v0,(QList<int> *)&local_188,"v0","(QVector<int>{4, 6, 1})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                             ,0xf4);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_188);
          if (bVar3) {
            resolver.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                 (Data *)0x400000002;
            args_01._M_len = 6;
            args_01._M_array = (iterator)&resolver;
            QList<int>::QList((QList<int> *)&local_188,args_01);
            QTest::qCompare<int>
                      (&v1,(QList<int> *)&local_188,"v1","(QVector<int>{2, 4, 0, 6, 6, 1})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                       ,0xf5);
            QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_188);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  QArrayDataPointer<int>::~QArrayDataPointer(&v1.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&v0.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&inputs.d);
  return;
}

Assistant:

void tst_qpromise_reduce::delayedRejected()
{
    QVector<int> inputs{4, 6, 8};
    QVector<int> v0;
    QVector<int> v1;

    auto p0 = QtPromise::resolve(inputs).reduce([&](int acc, int cur, int idx) {
        v0 << acc << cur << idx;
        if (cur == 6) {
            return QtPromise::QPromise<int>::reject(QString{"foo"});
        }
        return QtPromise::resolve(acc + cur + idx);
    });
    auto p1 = QtPromise::resolve(inputs).reduce(
        [&](int acc, int cur, int idx) {
            v1 << acc << cur << idx;
            if (cur == 6) {
                return QtPromise::QPromise<int>::reject(QString{"bar"});
            }
            return QtPromise::resolve(acc + cur + idx);
        },
        2);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});
    QCOMPARE(waitForError(p1, QString{}), QString{"bar"});
    QCOMPARE(v0, (QVector<int>{4, 6, 1}));
    QCOMPARE(v1, (QVector<int>{2, 4, 0, 6, 6, 1}));
}